

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> * __thiscall
vkt::sr::anon_unknown_0::TextureGather2DArrayInstance::computeQuadTexCoord
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,
          TextureGather2DArrayInstance *this,int iterationNdx)

{
  int layerNdx;
  const_reference pvVar1;
  Vector<float,_2> local_3c [2];
  Vector<float,_2> local_28;
  undefined1 local_1d;
  int local_1c;
  TextureGather2DArrayInstance *pTStack_18;
  int iterationNdx_local;
  TextureGather2DArrayInstance *this_local;
  vector<float,_std::allocator<float>_> *res;
  
  local_1d = 0;
  local_1c = iterationNdx;
  pTStack_18 = this;
  this_local = (TextureGather2DArrayInstance *)__return_storage_ptr__;
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__);
  pvVar1 = std::
           vector<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
           ::operator[](&this->m_iterations,(long)local_1c);
  layerNdx = pvVar1->layerNdx;
  tcu::Vector<float,_2>::Vector(&local_28,-0.3,-0.4);
  tcu::Vector<float,_2>::Vector(local_3c,1.5,1.6);
  TextureTestUtil::computeQuadTexCoord2DArray(__return_storage_ptr__,layerNdx,&local_28,local_3c);
  return __return_storage_ptr__;
}

Assistant:

vector<float> TextureGather2DArrayInstance::computeQuadTexCoord (int iterationNdx) const
{
	vector<float> res;
	TextureTestUtil::computeQuadTexCoord2DArray(res, m_iterations[iterationNdx].layerNdx, Vec2(-0.3f, -0.4f), Vec2(1.5f, 1.6f));
	return res;
}